

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_pages_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::testPages(FuzzHelper *this)

{
  pointer pQVar1;
  QPDFObjGen og;
  pointer this_00;
  pointer pQVar2;
  shared_ptr<QPDF> q;
  QPDFObjectHandle page_obj;
  DiscardContents discard_contents;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_210;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_1f8;
  JSON local_1e0;
  QPDFAcroFormDocumentHelper afdh;
  QPDFPageDocumentHelper pdh;
  undefined1 local_190 [16];
  QPDFOutlineDocumentHelper odh;
  QPDFPageLabelDocumentHelper pldh;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_128;
  string local_f8;
  QPDFAnnotationObjectHelper local_d8;
  QPDFFormFieldObjectHelper local_a0;
  QPDFPageObjectHelper local_68;
  
  getQpdf((FuzzHelper *)&q);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            (&pdh,q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            (&pldh,q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            (&odh,q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            (&afdh,q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded(&afdh);
  QPDFPageDocumentHelper::flattenAnnotations(&pdh,0,3);
  discard_contents.super_ParserCallbacks._vptr_ParserCallbacks =
       (ParserCallbacks)&PTR__ParserCallbacks_002abab8;
  QPDFPageDocumentHelper::getAllPages(&local_1f8,&pdh);
  for (this_00 = local_1f8.
                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_1f8.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    QPDFPageObjectHelper::coalesceContentStreams(this_00);
    QPDFPageObjectHelper::parseContents(this_00,&discard_contents.super_ParserCallbacks);
    QPDFPageObjectHelper::getImages_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                *)&local_128,this_00);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_128);
    QPDFPageLabelDocumentHelper::getLabelForPage
              ((QPDFPageLabelDocumentHelper *)local_190,(longlong)&pldh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 8));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page_obj,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this_00->super_QPDFObjectHelper).super_BaseHandle);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)&local_1e0,
               (int)(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page_obj,true);
    JSON::unparse_abi_cxx11_(&local_f8,&local_1e0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&page_obj.super_BaseHandle);
    QPDFOutlineDocumentHelper::getOutlinesForPage(&local_140,&odh,og);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (&local_140);
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,this_00);
    QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(&local_210,&afdh,&local_68);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
    pQVar1 = local_210.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar2 = local_210.
                  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                  ._M_impl.super__Vector_impl_data._M_start; pQVar2 != pQVar1; pQVar2 = pQVar2 + 1)
    {
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_d8,pQVar2);
      QPDFAcroFormDocumentHelper::getFieldForAnnotation(&local_a0,&afdh,&local_d8);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_a0);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_d8);
    }
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (&local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_1f8);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&odh);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&pdh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
FuzzHelper::testPages()
{
    // Parse all content streams, and exercise some helpers that
    // operate on pages.
    std::shared_ptr<QPDF> q = getQpdf();
    QPDFPageDocumentHelper pdh(*q);
    QPDFPageLabelDocumentHelper pldh(*q);
    QPDFOutlineDocumentHelper odh(*q);
    QPDFAcroFormDocumentHelper afdh(*q);
    afdh.generateAppearancesIfNeeded();
    pdh.flattenAnnotations();
    DiscardContents discard_contents;
    int pageno = 0;
    for (auto& page: pdh.getAllPages()) {
        ++pageno;
        try {
            page.coalesceContentStreams();
            page.parseContents(&discard_contents);
            page.getImages();
            pldh.getLabelForPage(pageno);
            QPDFObjectHandle page_obj(page.getObjectHandle());
            page_obj.getJSON(JSON::LATEST, true).unparse();
            odh.getOutlinesForPage(page_obj);

            for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
                afdh.getFieldForAnnotation(aoh);
            }
        } catch (QPDFExc& e) {
            std::cerr << "page " << pageno << ": " << e.what() << '\n';
        }
    }
}